

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O2

TimeZone * icu_63::ZoneMeta::createCustomTimeZone(int32_t offset)

{
  uint uVar1;
  SimpleTimeZone *this;
  ulong size;
  ulong uVar2;
  UnicodeString zid;
  
  uVar2 = (ulong)(uint)-offset;
  if (0 < offset) {
    uVar2 = (ulong)(uint)offset;
  }
  uVar1 = (uint)(ushort)(uVar2 / 60000) % 0x3c;
  size = (ulong)(ushort)uVar1;
  zid.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003daac8;
  zid.fUnion.fStackFields.fLengthAndFlags = 2;
  formatCustomID((uint8_t)(uVar2 / 3600000),(uint8_t)uVar1,(uint8_t)((uVar2 / 1000) % 0x3c),
                 (byte)((uint)offset >> 0x1f),&zid);
  this = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,size);
  if (this != (SimpleTimeZone *)0x0) {
    SimpleTimeZone::SimpleTimeZone(this,offset,&zid);
  }
  UnicodeString::~UnicodeString(&zid);
  return (TimeZone *)this;
}

Assistant:

TimeZone*
ZoneMeta::createCustomTimeZone(int32_t offset) {
    UBool negative = FALSE;
    int32_t tmp = offset;
    if (offset < 0) {
        negative = TRUE;
        tmp = -offset;
    }
    uint8_t hour, min, sec;

    tmp /= 1000;
    sec = static_cast<uint8_t>(tmp % 60);
    tmp /= 60;
    min = static_cast<uint8_t>(tmp % 60);
    hour = static_cast<uint8_t>(tmp / 60);

    UnicodeString zid;
    formatCustomID(hour, min, sec, negative, zid);
    return new SimpleTimeZone(offset, zid);
}